

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCModule.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  
  if ((*(uint *)(ctx + 4) & 0x7fffffef) != 0) {
    return 5;
  }
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  Sparc_init(MRI);
  *(code **)(ctx + 8) = Sparc_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = Sparc_getInstruction;
  *(code **)(ctx + 0x50) = Sparc_post_printer;
  *(code **)(ctx + 0x30) = Sparc_reg_name;
  *(code **)(ctx + 0x48) = Sparc_get_insn_id;
  *(code **)(ctx + 0x38) = Sparc_insn_name;
  *(code **)(ctx + 0x40) = Sparc_group_name;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 |
				CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = (MCRegisterInfo *) cs_mem_malloc(sizeof(*mri));

	PPC_init(mri);
	ud->printer = PPC_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = PPC_getInstruction;
	ud->post_printer = PPC_post_printer;

	ud->reg_name = PPC_reg_name;
	ud->insn_id = PPC_get_insn_id;
	ud->insn_name = PPC_insn_name;
	ud->group_name = PPC_group_name;

	return CS_ERR_OK;
}